

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReverseSeqLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reverseseq(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ReverseSeqLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_reverseseq(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reverseseq(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ReverseSeqLayerParams>(arena);
    (this->layer_).reverseseq_ = pRVar2;
  }
  return (ReverseSeqLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReverseSeqLayerParams* NeuralNetworkLayer::_internal_mutable_reverseseq() {
  if (!_internal_has_reverseseq()) {
    clear_layer();
    set_has_reverseseq();
    layer_.reverseseq_ = CreateMaybeMessage< ::CoreML::Specification::ReverseSeqLayerParams >(GetArenaForAllocation());
  }
  return layer_.reverseseq_;
}